

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zesFrequencyOcGetCapabilities
          (zes_freq_handle_t hFrequency,zes_oc_capabilities_t *pOcCapabilities)

{
  zes_pfnFrequencyOcGetCapabilities_t pfnOcGetCapabilities;
  ze_result_t result;
  zes_oc_capabilities_t *pOcCapabilities_local;
  zes_freq_handle_t hFrequency_local;
  
  pfnOcGetCapabilities._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011cc40 != (code *)0x0) {
    pfnOcGetCapabilities._4_4_ = (*DAT_0011cc40)(hFrequency,pOcCapabilities);
  }
  return pfnOcGetCapabilities._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesFrequencyOcGetCapabilities(
        zes_freq_handle_t hFrequency,                   ///< [in] Handle for the component.
        zes_oc_capabilities_t* pOcCapabilities          ///< [in,out] Pointer to the capabilities structure.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnOcGetCapabilities = context.zesDdiTable.Frequency.pfnOcGetCapabilities;
        if( nullptr != pfnOcGetCapabilities )
        {
            result = pfnOcGetCapabilities( hFrequency, pOcCapabilities );
        }
        else
        {
            // generic implementation
        }

        return result;
    }